

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::add<unsigned_long,cmdline::default_reader<unsigned_long>>
          (parser *this,key_type *name,char short_name,undefined8 desc,undefined1 need,
          undefined8 def)

{
  size_type sVar1;
  option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_> *poVar2;
  mapped_type *ppoVar3;
  cmdline_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar1 == 0) {
    poVar2 = (option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_>
              *)operator_new(0x70);
    option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_>::
    option_with_value_with_reader(poVar2,name,(int)short_name,need,def,desc);
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[](&this->options,name);
    *ppoVar3 = (mapped_type)poVar2;
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[](&this->options,name);
    std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
    push_back(&this->ordered,ppoVar3);
    return;
  }
  this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_50,"multiple definition: ",name);
  cmdline_error::cmdline_error(this_00,&local_50);
  __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "", bool need = true,
             const T def = T(), F reader = F()) {
        if (options.count(name)) throw cmdline_error("multiple definition: " + name);
        options[name] = new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
        ordered.push_back(options[name]);
    }